

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  color_quad_u8 *pcVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  endpoint_indices_details *peVar9;
  color_cluster *pcVar10;
  color_quad_u8 (*pacVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint s;
  uint uVar14;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  uint p;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint s_3;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  uint s_1;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint E4 [8] [16];
  uint E8 [4] [256];
  int local_1338 [64];
  int local_1238 [128];
  int local_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar23 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar20 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar23;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar20 * data;
  uVar23 = ((data + 1) * uVar20) / uVar23;
  if (SUB164(auVar13 / auVar12,0) < (uint)uVar23) {
    uVar20 = SUB168(auVar13 / auVar12,0) & 0xffffffff;
    do {
      peVar9 = (this->m_endpoint_indices).m_p;
      uVar7 = peVar9[uVar20].field_0.field_0.color;
      pcVar10 = (this->m_color_clusters).m_p;
      bVar3 = this->m_has_subblocks;
      bVar4 = (this->m_params).m_perceptual;
      pacVar11 = this->m_blocks;
      piVar16 = local_1338;
      uVar25 = 0;
      do {
        pcVar1 = pacVar11[uVar20] + uVar25;
        lVar15 = 0;
        do {
          if (bVar3 == false) {
            iVar21 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar7].color_values[lVar15].field_0.field_0.r;
            bVar5 = pcVar10[uVar7].color_values[lVar15].field_0.field_0.g;
            bVar6 = pcVar10[uVar7].color_values[lVar15].field_0.field_0.b;
          }
          else {
            uVar8 = peVar9[((uint)(uVar25 >> 3) & 0x1fffffff) + (int)uVar20 * 2].field_0.field_0.
                    color;
            iVar21 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar8].color_values[lVar15].field_0.field_0.r;
            bVar5 = pcVar10[uVar8].color_values[lVar15].field_0.field_0.g;
            bVar6 = pcVar10[uVar8].color_values[lVar15].field_0.field_0.b;
          }
          if ((bVar4 & 1U) == 0) {
            iVar29 = (uint)(pcVar1->field_0).field_0.g - (uint)bVar5;
            iVar18 = (uint)(pcVar1->field_0).field_0.b - (uint)bVar6;
            iVar21 = iVar18 * iVar18 + iVar29 * iVar29 + iVar21 * iVar21;
          }
          else {
            iVar29 = (uint)(pcVar1->field_0).field_0.g - (uint)bVar5;
            iVar18 = (uint)(pcVar1->field_0).field_0.b - (uint)bVar6;
            iVar21 = iVar18 * iVar18 + iVar29 * iVar29 * 0x19 + iVar21 * iVar21 * 8;
          }
          piVar16[lVar15] = iVar21;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        uVar25 = uVar25 + 1;
        piVar16 = piVar16 + 4;
      } while (uVar25 != 0x10);
      piVar16 = local_1238;
      lVar15 = 0;
      do {
        lVar27 = 0;
        do {
          piVar16[lVar27] =
               *(int *)((long)local_1338 +
                       (ulong)((uint)lVar27 & 0xfffffffc) + (lVar15 * 2 + 1) * 0x10) +
               local_1338[lVar15 * 8 + (ulong)((uint)lVar27 & 3)];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x10);
        lVar15 = lVar15 + 1;
        piVar16 = piVar16 + 0x10;
      } while (lVar15 != 8);
      piVar16 = local_1038;
      lVar15 = 0;
      do {
        uVar25 = 0;
        do {
          piVar16[uVar25] =
               local_1238[(lVar15 * 2 + 1) * 0x10 + (uVar25 >> 4 & 0xfffffff)] +
               local_1238[lVar15 * 0x20 + (ulong)((uint)uVar25 & 0xf)];
          uVar25 = uVar25 + 1;
        } while (uVar25 != 0x100);
        lVar15 = lVar15 + 1;
        piVar16 = piVar16 + 0x100;
      } while (lVar15 != 4);
      uVar25 = (ulong)(this->m_color_selectors).m_size;
      if (uVar25 == 0) {
        uVar14 = 0;
      }
      else {
        uVar19 = 0;
        uVar22 = 0xffffffff;
        uVar17 = 0;
        do {
          uVar14 = (this->m_color_selectors).m_p[uVar19];
          uVar26 = aiStack_c38[uVar14 >> 8 & 0xff] + local_1038[uVar14 & 0xff] +
                   *(int *)((long)aiStack_838 + (ulong)(uVar14 >> 0xe & 0x3fc)) +
                   aiStack_438[uVar14 >> 0x18];
          if (uVar26 < uVar22) {
            uVar17 = uVar19 & 0xffffffff;
          }
          uVar14 = (uint)uVar17;
          if (uVar26 < uVar22) {
            uVar22 = uVar26;
          }
          uVar19 = uVar19 + 1;
        } while (uVar25 != uVar19);
      }
      lVar27 = (ulong)uVar14 * 0x104 + *pData_ptr;
      piVar16 = local_1338;
      lVar28 = 0;
      lVar15 = lVar27;
      do {
        lVar24 = 0;
        do {
          piVar2 = (int *)(lVar15 + lVar24 * 4);
          *piVar2 = *piVar2 + piVar16[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        lVar28 = lVar28 + 1;
        piVar16 = piVar16 + 4;
        lVar15 = lVar15 + 0x10;
      } while (lVar28 != 0x10);
      *(undefined1 *)(lVar27 + 0x100) = 1;
      (this->m_selector_indices).m_p[(uint)((int)uVar20 << (this->m_has_subblocks & 0x1fU))].field_0
      .field_0.color = (uint16)uVar14;
      uVar20 = uVar20 + 1;
    } while (uVar20 < (uVar23 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E2[16][4];
        uint E4[8][16];
        uint E8[4][256];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
            color_quad_u8* endpoint_colors = cluster.color_values;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) : color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
                }
            }
            for (uint p = 0; p < 8; p++)
            {
                for (uint s = 0; s < 16; s++)
                {
                    E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
                }
            }
            for (uint p = 0; p < 4; p++)
            {
                for (uint s = 0; s < 256; s++)
                {
                    E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
                }
            }
            uint best_index = 0;
            for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++)
            {
                uint32 selector = m_color_selectors[s];
                uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
                if (error < best_error)
                {
                    best_error = error;
                    best_index = s;
                }
            }
            uint(&total_errors)[16][4] = selector_details[best_index].error;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    total_errors[p][s] += E2[p][s];
                }
            }
            selector_details[best_index].used = true;
            m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
        }
    }